

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall doctest::detail::anon_class_416_2_abd2a4d0::pop(anon_class_416_2_abd2a4d0 *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  reference pvVar5;
  streamoff sVar6;
  undefined8 uVar7;
  String *in_RDI;
  uint sz;
  streampos pos;
  logic_error *in_stack_ffffffffffffff60;
  istream *in_stack_ffffffffffffff68;
  String *this_00;
  fpos<__mbstate_t> local_58 [20];
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  logic_error local_20 [32];
  
  this_00 = in_RDI;
  bVar3 = std::vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>::empty
                    ((vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_> *)
                     in_RDI);
  if (!bVar3) {
    pvVar5 = std::vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>::back
                       ((vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_> *)
                        in_stack_ffffffffffffff60);
    local_40 = *(undefined8 *)pvVar5;
    local_38 = *(undefined8 *)(pvVar5 + 8);
    std::vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>::pop_back
              ((vector<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_> *)0x107859)
    ;
    local_58._0_16_ = std::ostream::tellp();
    sVar6 = std::fpos<__mbstate_t>::operator-(local_58,(fpos<__mbstate_t> *)&local_40);
    local_44 = (undefined4)sVar6;
    uVar7 = std::__cxx11::stringstream::rdbuf();
    uVar2 = local_38;
    uVar1 = local_40;
    _Var4 = std::operator|(_S_in,_S_out);
    std::streambuf::pubseekpos(uVar7,uVar1,uVar2,_Var4);
    String::String(this_00,in_stack_ffffffffffffff68,(uint)((ulong)uVar7 >> 0x20));
    return in_RDI;
  }
  std::logic_error::logic_error
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]read-excel/test/string/../../test/doctest/doctest.h:3173: Internal doctest error: TLSS was empty when trying to pop!"
            );
  anon_unknown_14::throw_exception<std::logic_error>(in_stack_ffffffffffffff60);
}

Assistant:

String pop() {
            if (stack.empty())
                DOCTEST_INTERNAL_ERROR("TLSS was empty when trying to pop!");

            std::streampos pos = stack.back();
            stack.pop_back();
            unsigned sz = static_cast<unsigned>(ss.tellp() - pos);
            ss.rdbuf()->pubseekpos(pos, std::ios::in | std::ios::out);
            return String(ss, sz);
        }